

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  char cVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  cmValue cVar10;
  cmState *this_00;
  pointer this_01;
  string *this_02;
  long lVar11;
  string_view separator;
  string_view separator_00;
  string_view separator_01;
  string_view separator_02;
  string_view separator_03;
  string_view separator_04;
  string_view separator_05;
  string_view separator_06;
  string_view separator_07;
  string_view separator_08;
  string_view separator_09;
  string_view separator_10;
  pair<bool,_cmValue> pVar12;
  undefined1 local_33a;
  undefined1 local_339;
  cmStateSnapshot local_338;
  undefined1 local_320 [64];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar5 != 0)) {
    std::__cxx11::string::string
              ((string *)local_320,(string *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)(local_320 + 0x20),
               (string *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_2e0,(string *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_2c0,(string *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_2a0,(string *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    std::__cxx11::string::string
              (local_280,(string *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string(local_260,(string *)(anonymous_namespace)::propTYPE_abi_cxx11_);
    std::__cxx11::string::string
              (local_240,(string *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_220,(string *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    std::__cxx11::string::string
              (local_200,(string *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_1e0,(string *)(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_1c0,(string *)(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    std::__cxx11::string::string
              (local_1a0,(string *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    std::__cxx11::string::string
              (local_180,(string *)(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    std::__cxx11::string::string(local_160,(string *)(anonymous_namespace)::propIMPORTED_abi_cxx11_)
    ;
    std::__cxx11::string::string
              (local_140,(string *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    std::__cxx11::string::string
              (local_120,(string *)(anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
              );
    std::__cxx11::string::string(local_100,(string *)(anonymous_namespace)::propNAME_abi_cxx11_);
    std::__cxx11::string::string
              (local_e0,(string *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    std::__cxx11::string::string
              (local_c0,(string *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    std::__cxx11::string::string(local_a0,(string *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
    std::__cxx11::string::string
              (local_80,(string *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    std::__cxx11::string::string
              (local_60,(string *)
                        (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
    std::__cxx11::string::string
              (local_40,(string *)
                        (anonymous_namespace)::
                        propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_320,
               &stack0xffffffffffffffe0,0,&local_338,&local_339,&local_33a);
    lVar11 = 0x2e0;
    do {
      std::__cxx11::string::~string((string *)(local_320 + lVar11));
      lVar11 = lVar11 + -0x20;
    } while (lVar11 != -0x20);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  sVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (sVar6 != 0) {
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    if ((((_Var3) ||
         (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_), _Var3
         )) || (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_)
               , _Var3)) ||
       ((_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_), _Var3
        || (_Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_),
           _Var3)))) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&(((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LanguageStandardProperties)._M_t,prop);
      if (iVar7._M_node !=
          (_Base_ptr)
          ((long)&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  LanguageStandardProperties + 8U)) {
        return (cmValue)(iVar7._M_node + 2);
      }
      return (cmValue)(_Base_ptr)0x0;
    }
    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    if (_Var3) {
      _Var2._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if (*(pointer *)
           &((_Var2._M_head_impl)->LinkImplementationPropertyEntries).
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          == *(pointer *)((long)&(_Var2._M_head_impl)->LinkImplementationPropertyEntries + 8)) {
        return (cmValue)(_Base_ptr)0x0;
      }
      if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
         (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_),
         iVar5 != 0)) {
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
      }
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                ((string *)local_320,
                 &((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  LinkImplementationPropertyEntries,separator);
      this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
    }
    else {
      _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_
                             );
      if (_Var3) {
        _Var2._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        if (*(pointer *)
             &((_Var2._M_head_impl)->LinkInterfacePropertyEntries).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            == *(pointer *)((long)&(_Var2._M_head_impl)->LinkInterfacePropertyEntries + 8)) {
          return (cmValue)(_Base_ptr)0x0;
        }
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar5 != 0)) {
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0'
          ;
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        separator_00._M_str = ";";
        separator_00._M_len = 1;
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  ((string *)local_320,
                   &((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    LinkInterfacePropertyEntries,separator_00);
        this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
      }
      else {
        _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::
                                        propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
        if (_Var3) {
          _Var2._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          if (*(pointer *)
               &((_Var2._M_head_impl)->LinkInterfaceDirectPropertyEntries).
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              == *(pointer *)((long)&(_Var2._M_head_impl)->LinkInterfaceDirectPropertyEntries + 8))
          {
            return (cmValue)(_Base_ptr)0x0;
          }
          if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_), iVar5 != 0)) {
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] =
                 '\0';
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle)
            ;
            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          }
          separator_01._M_str = ";";
          separator_01._M_len = 1;
          cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                    ((string *)local_320,
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectPropertyEntries,separator_01);
          this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
        }
        else {
          _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::
                                          propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
          if (_Var3) {
            _Var2._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if (*(pointer *)
                 &((_Var2._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries).
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                == *(pointer *)
                    ((long)&(_Var2._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries + 8)) {
              return (cmValue)(_Base_ptr)0x0;
            }
            if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
               (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                             output_abi_cxx11_), iVar5 != 0)) {
              GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                   (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
              GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
              GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] =
                   '\0';
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           &__dso_handle);
              __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
            }
            separator_02._M_str = ";";
            separator_02._M_len = 1;
            cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                      ((string *)local_320,
                       &((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                        LinkInterfaceDirectExcludePropertyEntries,separator_02);
            this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
          }
          else {
            _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(anonymous_namespace)::propTYPE_abi_cxx11_);
            if (_Var3) {
              p_Var8 = (_Base_ptr)
                       cmState::GetTargetTypeName_abi_cxx11_
                                 (((this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                  ->TargetType);
              return (cmValue)p_Var8;
            }
            _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(anonymous_namespace)::
                                            propINCLUDE_DIRECTORIES_abi_cxx11_);
            if (_Var3) {
              _Var2._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              if (*(pointer *)
                   &((_Var2._M_head_impl)->IncludeDirectoriesEntries).
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  == *(pointer *)((long)&(_Var2._M_head_impl)->IncludeDirectoriesEntries + 8)) {
                return (cmValue)(_Base_ptr)0x0;
              }
              if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                 (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                               output_abi_cxx11_), iVar5 != 0)) {
                GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                     (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
                GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
                GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0]
                     = '\0';
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                             &__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
              }
              separator_03._M_str = ";";
              separator_03._M_len = 1;
              cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                        ((string *)local_320,
                         &((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          IncludeDirectoriesEntries,separator_03);
              this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
            }
            else {
              _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_
                                     );
              if (_Var3) {
                _Var2._M_head_impl =
                     (this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                if (*(pointer *)
                     &((_Var2._M_head_impl)->CompileFeaturesEntries).
                      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    == *(pointer *)((long)&(_Var2._M_head_impl)->CompileFeaturesEntries + 8)) {
                  return (cmValue)(_Base_ptr)0x0;
                }
                if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                   (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                 output_abi_cxx11_), iVar5 != 0)) {
                  GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                       (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2
                  ;
                  GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
                  GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf
                  [0] = '\0';
                  __cxa_atexit(std::__cxx11::string::~string,
                               &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                               &__dso_handle);
                  __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
                }
                separator_04._M_str = ";";
                separator_04._M_len = 1;
                cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                          ((string *)local_320,
                           &((this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                            CompileFeaturesEntries,separator_04);
                this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
              }
              else {
                _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(anonymous_namespace)::
                                                propCOMPILE_OPTIONS_abi_cxx11_);
                if (_Var3) {
                  _Var2._M_head_impl =
                       (this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                  if (*(pointer *)
                       &((_Var2._M_head_impl)->CompileOptionsEntries).
                        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      == *(pointer *)((long)&(_Var2._M_head_impl)->CompileOptionsEntries + 8)) {
                    return (cmValue)(_Base_ptr)0x0;
                  }
                  if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                   output_abi_cxx11_), iVar5 != 0)) {
                    GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                         (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                                   field_2;
                    GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0
                    ;
                    GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf
                    [0] = '\0';
                    __cxa_atexit(std::__cxx11::string::~string,
                                 &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                 &__dso_handle);
                    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       );
                  }
                  separator_05._M_str = ";";
                  separator_05._M_len = 1;
                  cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                            ((string *)local_320,
                             &((this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              CompileOptionsEntries,separator_05);
                  this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                }
                else {
                  _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(anonymous_namespace)::
                                                  propCOMPILE_DEFINITIONS_abi_cxx11_);
                  if (_Var3) {
                    _Var2._M_head_impl =
                         (this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                    if (*(pointer *)
                         &((_Var2._M_head_impl)->CompileDefinitionsEntries).
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        == *(pointer *)((long)&(_Var2._M_head_impl)->CompileDefinitionsEntries + 8))
                    {
                      return (cmValue)(_Base_ptr)0x0;
                    }
                    if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                       (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                     output_abi_cxx11_), iVar5 != 0)) {
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                           (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                                     field_2;
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length =
                           0;
                      GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                      _M_local_buf[0] = '\0';
                      __cxa_atexit(std::__cxx11::string::~string,
                                   &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                   &__dso_handle);
                      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_);
                    }
                    separator_06._M_str = ";";
                    separator_06._M_len = 1;
                    cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                              ((string *)local_320,
                               &((this->impl)._M_t.
                                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                CompileDefinitionsEntries,separator_06);
                    this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                  }
                  else {
                    _Var3 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propLINK_OPTIONS_abi_cxx11_);
                    if (_Var3) {
                      _Var2._M_head_impl =
                           (this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                      if (*(pointer *)
                           &((_Var2._M_head_impl)->LinkOptionsEntries).
                            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          == *(pointer *)((long)&(_Var2._M_head_impl)->LinkOptionsEntries + 8)) {
                        return (cmValue)(_Base_ptr)0x0;
                      }
                      if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                         (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                       output_abi_cxx11_), iVar5 != 0)) {
                        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p
                             = (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                         .field_2;
                        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length
                             = 0;
                        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                        _M_local_buf[0] = '\0';
                        __cxa_atexit(std::__cxx11::string::~string,
                                     &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                     &__dso_handle);
                        __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                             output_abi_cxx11_);
                      }
                      separator_07._M_str = ";";
                      separator_07._M_len = 1;
                      cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                                ((string *)local_320,
                                 &((this->impl)._M_t.
                                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)
                                  ->LinkOptionsEntries,separator_07);
                      this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                    }
                    else {
                      _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propLINK_DIRECTORIES_abi_cxx11_);
                      if (_Var3) {
                        _Var2._M_head_impl =
                             (this->impl)._M_t.
                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                             .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                        if (*(pointer *)
                             &((_Var2._M_head_impl)->LinkDirectoriesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            == *(pointer *)((long)&(_Var2._M_head_impl)->LinkDirectoriesEntries + 8)
                           ) {
                          return (cmValue)(_Base_ptr)0x0;
                        }
                        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
                           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                                         output_abi_cxx11_), iVar5 != 0)) {
                          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                          _M_p = (pointer)&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_.field_2;
                          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                          _M_string_length = 0;
                          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                          _M_local_buf[0] = '\0';
                          __cxa_atexit(std::__cxx11::string::~string,
                                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                                       &__dso_handle);
                          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                               output_abi_cxx11_);
                        }
                        separator_08._M_str = ";";
                        separator_08._M_len = 1;
                        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                                  ((string *)local_320,
                                   &((this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                    )->LinkDirectoriesEntries,separator_08);
                        this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                      }
                      else {
                        _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
                        if (_Var3) {
                          if (*(size_t *)
                               ((long)&((this->impl)._M_t.
                                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                        .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                       _M_head_impl)->Utilities + 0x28) == 0) {
                            return (cmValue)(_Base_ptr)0x0;
                          }
                          if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0')
                             && (iVar5 = __cxa_guard_acquire(&
                                                  GetProperty(std::__cxx11::string_const&)::
                                                  output_abi_cxx11_), iVar5 != 0)) {
                            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                            _M_p = (pointer)&GetProperty(std::__cxx11::string_const&)::
                                             output_abi_cxx11_.field_2;
                            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                            _M_string_length = 0;
                            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                            _M_local_buf[0] = '\0';
                            __cxa_atexit(std::__cxx11::string::~string,
                                         &GetProperty(std::__cxx11::string_const&)::
                                          output_abi_cxx11_,&__dso_handle);
                            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                                 output_abi_cxx11_);
                          }
                          if ((GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ ==
                               '\0') &&
                             (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)
                                                           ::utilities_abi_cxx11_), iVar5 != 0)) {
                            GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            __cxa_atexit(std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::~vector,
                                         &GetProperty(std::__cxx11::string_const&)::
                                          utilities_abi_cxx11_,&__dso_handle);
                            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                                 utilities_abi_cxx11_);
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                                   *(size_t *)
                                    ((long)&((this->impl)._M_t.
                                             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                             .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                            _M_head_impl)->Utilities + 0x28));
                          _Var2._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          p_Var9 = *(_Base_ptr *)((long)&(_Var2._M_head_impl)->Utilities + 0x18);
                          this_01 = GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          while (p_Var9 != (_Rb_tree_node_base *)
                                           ((long)&(_Var2._M_head_impl)->Utilities + 8U)) {
                            std::__cxx11::string::string((string *)local_320,(string *)(p_Var9 + 1))
                            ;
                            std::__cxx11::string::operator=((string *)this_01,(string *)local_320);
                            std::__cxx11::string::~string((string *)local_320);
                            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
                            this_01 = this_01 + 1;
                          }
                          separator_10._M_str = ";";
                          separator_10._M_len = 1;
                          cmJoin((string *)local_320,
                                 &GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
                                 separator_10,(string_view)ZEXT816(0));
                          this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                        }
                        else {
                          _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propPRECOMPILE_HEADERS_abi_cxx11_);
                          if (!_Var3) {
                            _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::propIMPORTED_abi_cxx11_);
                            if (_Var3) {
                              cVar1 = ((this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                      _M_head_impl)->IsImportedTarget;
                            }
                            else {
                              _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propIMPORTED_GLOBAL_abi_cxx11_);
                              if (!_Var3) {
                                _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::propNAME_abi_cxx11_);
                                if (_Var3) {
                                  return (cmValue)(_Base_ptr)
                                                  &((this->impl)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>
                                                  ._M_head_impl)->Name;
                                }
                                _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::propBINARY_DIR_abi_cxx11_
                                                  );
                                if (_Var3) {
                                  cmMakefile::GetStateSnapshot
                                            (((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->Makefile);
                                  cmStateSnapshot::GetDirectory
                                            ((cmStateDirectory *)local_320,&local_338);
                                  p_Var8 = (_Base_ptr)
                                           cmStateDirectory::GetCurrentBinary_abi_cxx11_
                                                     ((cmStateDirectory *)local_320);
                                  return (cmValue)p_Var8;
                                }
                                _Var3 = std::operator==(prop,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_
                                                  );
                                if (_Var3) {
                                  cmMakefile::GetStateSnapshot
                                            (((this->impl)._M_t.
                                              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                              .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                             _M_head_impl)->Makefile);
                                  cmStateSnapshot::GetDirectory
                                            ((cmStateDirectory *)local_320,&local_338);
                                  p_Var8 = (_Base_ptr)
                                           cmStateDirectory::GetCurrentSource_abi_cxx11_
                                                     ((cmStateDirectory *)local_320);
                                  return (cmValue)p_Var8;
                                }
                                goto LAB_001d0d43;
                              }
                              cVar1 = ((this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                      _M_head_impl)->ImportedGloballyVisible;
                            }
                            if (cVar1 != '\0') {
                              return (cmValue)(anonymous_namespace)::propTRUE_abi_cxx11_;
                            }
                            return (cmValue)(anonymous_namespace)::propFALSE_abi_cxx11_;
                          }
                          _Var2._M_head_impl =
                               (this->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
                          if (*(pointer *)
                               &((_Var2._M_head_impl)->PrecompileHeadersEntries).
                                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              == *(pointer *)
                                  ((long)&(_Var2._M_head_impl)->PrecompileHeadersEntries + 8)) {
                            return (cmValue)(_Base_ptr)0x0;
                          }
                          if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0')
                             && (iVar5 = __cxa_guard_acquire(&
                                                  GetProperty(std::__cxx11::string_const&)::
                                                  output_abi_cxx11_), iVar5 != 0)) {
                            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                            _M_p = (pointer)&GetProperty(std::__cxx11::string_const&)::
                                             output_abi_cxx11_.field_2;
                            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.
                            _M_string_length = 0;
                            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2.
                            _M_local_buf[0] = '\0';
                            __cxa_atexit(std::__cxx11::string::~string,
                                         &GetProperty(std::__cxx11::string_const&)::
                                          output_abi_cxx11_,&__dso_handle);
                            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                                                 output_abi_cxx11_);
                          }
                          separator_09._M_str = ";";
                          separator_09._M_len = 1;
                          cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                                    ((string *)local_320,
                                     &((this->impl)._M_t.
                                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                       .super__Head_base<0UL,_cmTargetInternals_*,_false>.
                                      _M_head_impl)->PrecompileHeadersEntries,separator_09);
                          this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)this_02,(string *)local_320);
    std::__cxx11::string::~string((string *)local_320);
    return (cmValue)this_02;
  }
LAB_001d0d43:
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pVar12 = anon_unknown.dwarf_37692d::FileSetType::ReadProperties
                     (&(_Var2._M_head_impl)->HeadersFileSets,this,_Var2._M_head_impl,prop);
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (cmValue)pVar12.second.Value;
  }
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pVar12 = anon_unknown.dwarf_37692d::FileSetType::ReadProperties
                     (&(_Var2._M_head_impl)->CxxModulesFileSets,this,_Var2._M_head_impl,prop);
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (cmValue)pVar12.second.Value;
  }
  _Var2._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pVar12 = anon_unknown.dwarf_37692d::FileSetType::ReadProperties
                     (&(_Var2._M_head_impl)->CxxModuleHeadersFileSets,this,_Var2._M_head_impl,prop);
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (cmValue)pVar12.second.Value;
  }
  cVar10 = cmPropertyMap::GetPropertyValue
                     (&((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Properties
                      ,prop);
  if (cVar10.Value == (string *)0x0) {
    this_00 = cmMakefile::GetState
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
    bVar4 = cmState::IsPropertyChained(this_00,prop,TARGET);
    if (bVar4) {
      cmMakefile::GetStateSnapshot
                (((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_320,&local_338);
      cVar10 = cmStateDirectory::GetProperty((cmStateDirectory *)local_320,prop,true);
      return (cmValue)cVar10.Value;
    }
    return (cmValue)(_Base_ptr)0x0;
  }
  return (cmValue)cVar10.Value;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propOBJC_STANDARD ||
        prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }
    if (prop == propLINK_LIBRARIES) {
      if (this->impl->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkImplementationPropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES) {
      if (this->impl->LinkInterfacePropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkInterfacePropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
      if (this->impl->LinkInterfaceDirectPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkInterfaceDirectPropertyEntries, ";");
      return cmValue(output);
    }
    if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
      if (this->impl->LinkInterfaceDirectExcludePropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output =
        cmJoin(this->impl->LinkInterfaceDirectExcludePropertyEntries, ";");
      return cmValue(output);
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (this->impl->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->IncludeDirectoriesEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_FEATURES) {
      if (this->impl->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileFeaturesEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (this->impl->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileOptionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (this->impl->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->CompileDefinitionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propLINK_OPTIONS) {
      if (this->impl->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkOptionsEntries, ";");
      return cmValue(output);
    }
    if (prop == propLINK_DIRECTORIES) {
      if (this->impl->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->LinkDirectoriesEntries, ";");

      return cmValue(output);
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmJoin(utilities, ";");
      return cmValue(output);
    }
    if (prop == propPRECOMPILE_HEADERS) {
      if (this->impl->PrecompileHeadersEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->impl->PrecompileHeadersEntries, ";");
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    auto headers =
      this->impl->HeadersFileSets.ReadProperties(this, this->impl.get(), prop);
    if (headers.first) {
      return headers.second;
    }
    auto cxx_modules = this->impl->CxxModulesFileSets.ReadProperties(
      this, this->impl.get(), prop);
    if (cxx_modules.first) {
      return cxx_modules.second;
    }
    auto cxx_module_headers =
      this->impl->CxxModuleHeadersFileSets.ReadProperties(
        this, this->impl.get(), prop);
    if (cxx_module_headers.first) {
      return cxx_module_headers.second;
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}